

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O3

void __thiscall TypeChecker::visit(TypeChecker *this,VariableNode *node)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  _Storage<std::reference_wrapper<Symbol>,_true> _Var3;
  optional<std::reference_wrapper<Symbol>_> oVar4;
  string name;
  VariableAnalyser analyser;
  FunctionAnalyser analyser_1;
  string local_a8;
  VariableAnalyser local_88;
  string local_70;
  FunctionAnalyser local_50;
  
  pcVar1 = (node->name_)._M_dataplus._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + (node->name_)._M_string_length);
  oVar4 = SymbolTable::lookup(this->symbols_,&local_a8,0);
  _Var3 = oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload;
  if (((undefined1  [16])
       oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    std::__throw_bad_optional_access();
  }
  VariableAnalyser::VariableAnalyser(&local_88);
  (**(code **)(*(long *)_Var3 + 0x10))(_Var3,&local_88);
  if (local_88.symbolValid_ == true) {
    if (((ulong)local_88.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
                super__Optional_payload_base<TypeName> >> 0x20 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    (this->type_).super__Optional_base<TypeName,_true,_true>._M_payload.
    super__Optional_payload_base<TypeName> =
         (_Optional_payload_base<TypeName>)
         ((ulong)local_88.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
                 super__Optional_payload_base<TypeName> & 0x1ffffffff);
  }
  else {
    FunctionAnalyser::FunctionAnalyser(&local_50);
    (**(code **)(*(long *)_Var3 + 0x10))(_Var3,&local_50);
    if (local_50.symbolValid_ != true) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Invalid symbol reference!","");
      reportError(&local_70,(Node *)node);
    }
    (this->type_).super__Optional_base<TypeName,_true,_true>._M_payload.
    super__Optional_payload_base<TypeName> = (_Optional_payload_base<TypeName>)0x100000001;
    local_50.super_SymbolVisitor._vptr_SymbolVisitor = (_func_int **)&PTR__FunctionAnalyser_0014fe80
    ;
    while (local_50.arguments_.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node
           .super__List_node_base._M_next != (_List_node_base *)&local_50.arguments_) {
      p_Var2 = (local_50.arguments_.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl.
                _M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(local_50.arguments_.super__List_base<TypeName,_std::allocator<TypeName>_>.
                      _M_impl._M_node.super__List_node_base._M_next,0x18);
      local_50.arguments_.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var2;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TypeChecker::visit(const VariableNode& node)
{
  auto name = node.getName();
  auto& symbol = symbols_.lookup(name).value().get();
  VariableAnalyser analyser{};
  symbol.accept(analyser);
  if(analyser.isSymbolValid())
    type_ = analyser.getType().value();
  else
  {
    FunctionAnalyser analyser{};
    symbol.accept(analyser);
    if(analyser.isSymbolValid())
      type_ = TypeName::Function;
    else
      reportError("Invalid symbol reference!", node);
  }
}